

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder__postinit(ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_allocation_callbacks *pAllocationCallbacks;
  ma_data_converter *pConverter;
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  _func_void_ptr_size_t_void_ptr *p_Var5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  ma_resampling_backend_vtable *pmVar12;
  ma_result mVar13;
  ma_result mVar14;
  void *pvVar15;
  ma_format internalFormat;
  ma_uint32 internalSampleRate;
  ma_uint32 internalChannels;
  ma_uint64 unused;
  ma_channel internalChannelMap [254];
  ma_format local_1b4;
  ma_uint32 local_1b0;
  uint local_1ac;
  ma_uint64 local_1a8;
  ma_data_converter_config local_1a0;
  ma_channel local_128 [264];
  
  mVar13 = ma_data_source_get_data_format
                     (pDecoder->pBackend,&local_1b4,&local_1ac,&local_1b0,local_128,0xfe);
  if (mVar13 == MA_SUCCESS) {
    uVar3 = pConfig->channels;
    mVar13 = MA_INVALID_ARGS;
    if (local_1ac < 0xff && uVar3 < 0xff) {
      local_1a0.formatOut = pConfig->format;
      if (pConfig->format == ma_format_unknown) {
        local_1a0.formatOut = local_1b4;
      }
      local_1a0.channelsOut = uVar3;
      if (uVar3 == 0) {
        local_1a0.channelsOut = local_1ac;
      }
      pDecoder->outputFormat = local_1a0.formatOut;
      pDecoder->outputChannels = local_1a0.channelsOut;
      local_1a0.sampleRateOut = pConfig->sampleRate;
      if (pConfig->sampleRate == 0) {
        local_1a0.sampleRateOut = local_1b0;
      }
      pDecoder->outputSampleRate = local_1a0.sampleRateOut;
      local_1a0.calculateLFEFromSpatialChannels = 0;
      local_1a0._52_8_ = 0;
      local_1a0._68_4_ = 0;
      local_1a0.formatIn = local_1b4;
      local_1a0.channelsIn = local_1ac;
      local_1a0.sampleRateIn = local_1b0;
      local_1a0.pChannelMapOut = pConfig->pChannelMap;
      uVar1 = pConfig->channelMixMode;
      uVar2 = pConfig->ditherMode;
      local_1a0._60_8_ = 0;
      uVar7 = (pConfig->resampling).format;
      uVar8 = (pConfig->resampling).channels;
      uVar9 = (pConfig->resampling).sampleRateIn;
      uVar10 = (pConfig->resampling).sampleRateOut;
      uVar11 = *(undefined8 *)&(pConfig->resampling).algorithm;
      pmVar12 = (pConfig->resampling).pBackendVTable;
      pvVar15 = (pConfig->resampling).pBackendUserData;
      local_1a0.resampling.linear.lpfOrder = (pConfig->resampling).linear.lpfOrder;
      local_1a0.resampling._44_4_ = *(undefined4 *)&(pConfig->resampling).field_0x2c;
      local_1a0.resampling.algorithm = (ma_resample_algorithm)uVar11;
      local_1a0.resampling._20_4_ = SUB84((ulong)uVar11 >> 0x20,0);
      local_1a0.resampling.pBackendVTable._0_4_ = SUB84(pmVar12,0);
      local_1a0.resampling.pBackendVTable._4_4_ = (undefined4)((ulong)pmVar12 >> 0x20);
      local_1a0.resampling.pBackendUserData._0_4_ = SUB84(pvVar15,0);
      local_1a0.resampling.pBackendUserData._4_4_ = (undefined4)((ulong)pvVar15 >> 0x20);
      pAllocationCallbacks = &pDecoder->allocationCallbacks;
      pConverter = &pDecoder->converter;
      local_1a0.pChannelMapIn = local_128;
      local_1a0.ditherMode = uVar2;
      local_1a0.channelMixMode = uVar1;
      local_1a0.resampling.format = uVar7;
      local_1a0.resampling.channels = uVar8;
      local_1a0.resampling.sampleRateIn = uVar9;
      local_1a0.resampling.sampleRateOut = uVar10;
      mVar13 = ma_data_converter_init(&local_1a0,pAllocationCallbacks,pConverter);
      if ((mVar13 == MA_SUCCESS) &&
         (mVar14 = ma_data_converter_get_required_input_frame_count(pConverter,1,&local_1a8),
         mVar13 = MA_SUCCESS, mVar14 != MA_SUCCESS)) {
        iVar4 = (&DAT_0017d490)[local_1b4];
        mVar13 = MA_SUCCESS;
        uVar6 = 0x1000 / (ulong)(iVar4 * local_1ac);
        pDecoder->inputCacheCap = uVar6;
        p_Var5 = (pDecoder->allocationCallbacks).onMalloc;
        if (p_Var5 == (_func_void_ptr_size_t_void_ptr *)0x0) {
          pvVar15 = (void *)0x0;
        }
        else {
          pvVar15 = (*p_Var5)(uVar6 * (iVar4 * local_1ac),pAllocationCallbacks->pUserData);
        }
        pDecoder->pInputCache = pvVar15;
        if (pvVar15 == (void *)0x0) {
          ma_data_converter_uninit(pConverter,pAllocationCallbacks);
          mVar13 = MA_OUT_OF_MEMORY;
        }
      }
    }
  }
  if (mVar13 != MA_SUCCESS) {
    ma_decoder_uninit(pDecoder);
  }
  return mVar13;
}

Assistant:

static ma_result ma_decoder__postinit(const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;

    result = ma_decoder__init_data_converter(pDecoder, pConfig);

    /* If we failed post initialization we need to uninitialize the decoder before returning to prevent a memory leak. */
    if (result != MA_SUCCESS) {
        ma_decoder_uninit(pDecoder);
        return result;
    }

    return result;
}